

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

FieldDescriptor * __thiscall
google::protobuf::Reflection::GetOneofFieldDescriptor
          (Reflection *this,Message *message,OneofDescriptor *oneof_descriptor)

{
  bool bVar1;
  uint32_t number;
  FieldDescriptor *field;
  FieldDescriptor *pFVar2;
  
  bVar1 = OneofDescriptor::is_synthetic(oneof_descriptor);
  if (bVar1) {
    field = OneofDescriptor::field(oneof_descriptor,0);
    bVar1 = HasField(this,message,field);
    pFVar2 = (FieldDescriptor *)0x0;
    if (bVar1) {
      pFVar2 = field;
    }
  }
  else {
    number = GetOneofCase(this,message,oneof_descriptor);
    if (number != 0) {
      pFVar2 = Descriptor::FindFieldByNumber(this->descriptor_,number);
      return pFVar2;
    }
    pFVar2 = (FieldDescriptor *)0x0;
  }
  return pFVar2;
}

Assistant:

const FieldDescriptor* Reflection::GetOneofFieldDescriptor(
    const Message& message, const OneofDescriptor* oneof_descriptor) const {
  if (oneof_descriptor->is_synthetic()) {
    const FieldDescriptor* field = oneof_descriptor->field(0);
    return HasField(message, field) ? field : nullptr;
  }
  uint32_t field_number = GetOneofCase(message, oneof_descriptor);
  if (field_number == 0) {
    return nullptr;
  }
  return descriptor_->FindFieldByNumber(field_number);
}